

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_double(AMQP_VALUE value,double *double_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || double_value == (double *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x30a;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_double",0x309,1,"Bad arguments: value = %p, double_value = %p",value
                ,double_value);
    }
  }
  else if (value->type == AMQP_TYPE_DOUBLE) {
    *double_value = (double)(value->value).described_value.descriptor;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x313;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_double",0x312,1,"Value is not of type DOUBLE");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_double(AMQP_VALUE value, double* double_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_090: [If any of the arguments is NULL then amqpvalue_get_double shall return a non-zero value.] */
    if ((value == NULL) ||
        (double_value == NULL))
    {
        LogError("Bad arguments: value = %p, double_value = %p",
            value, double_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_091: [If the type of the value is not double (was not created with amqpvalue_create_double), then amqpvalue_get_double shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_DOUBLE)
        {
            LogError("Value is not of type DOUBLE");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_088: [amqpvalue_get_double shall fill in the double_value argument the double value stored by the AMQP value indicated by the value argument.] */
            *double_value = value_data->value.double_value;

            /* Codes_SRS_AMQPVALUE_01_089: [On success amqpvalue_get_double shall return 0.] */
            result = 0;
        }
    }

    return result;
}